

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O1

int uv_poll_start(uv_poll_t *handle,int pevents,uv_poll_cb poll_cb)

{
  uint *puVar1;
  uint uVar2;
  
  if (7 < (uint)pevents) {
    __assert_fail("(pevents & ~(UV_READABLE | UV_WRITABLE | UV_DISCONNECT)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/poll.c"
                  ,0x68,"int uv_poll_start(uv_poll_t *, int, uv_poll_cb)");
  }
  if ((handle->flags & 3) == 0) {
    uv__poll_stop(handle);
    if (pevents != 0) {
      uVar2 = (pevents & 1U) + 0x2000 + (pevents & 2U) * 2;
      if ((uint)pevents < 4) {
        uVar2 = (pevents & 1U) + (pevents & 2U) * 2;
      }
      uv__io_start(handle->loop,&handle->io_watcher,uVar2);
      uVar2 = handle->flags;
      if (((uVar2 >> 0xe & 1) == 0) && (handle->flags = uVar2 | 0x4000, (uVar2 >> 0xd & 1) != 0)) {
        puVar1 = &handle->loop->active_handles;
        *puVar1 = *puVar1 + 1;
      }
      handle->poll_cb = poll_cb;
    }
    return 0;
  }
  __assert_fail("!uv__is_closing(handle)",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/poll.c"
                ,0x69,"int uv_poll_start(uv_poll_t *, int, uv_poll_cb)");
}

Assistant:

int uv_poll_start(uv_poll_t* handle, int pevents, uv_poll_cb poll_cb) {
  int events;

  assert((pevents & ~(UV_READABLE | UV_WRITABLE | UV_DISCONNECT)) == 0);
  assert(!uv__is_closing(handle));

  uv__poll_stop(handle);

  if (pevents == 0)
    return 0;

  events = 0;
  if (pevents & UV_READABLE)
    events |= POLLIN;
  if (pevents & UV_WRITABLE)
    events |= POLLOUT;
  if (pevents & UV_DISCONNECT)
    events |= UV__POLLRDHUP;

  uv__io_start(handle->loop, &handle->io_watcher, events);
  uv__handle_start(handle);
  handle->poll_cb = poll_cb;

  return 0;
}